

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_peek.c
# Opt level: O2

ssize_t mpt_queue_peek(mpt_decode_queue *qu,size_t max,void *dst)

{
  size_t *psVar1;
  void *pvVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  mpt_data_decoder_t p_Var10;
  ulong uVar11;
  mpt_message local_58;
  iovec src;
  
  uVar8 = (qu->data).len;
  uVar7 = 0xfffffffffffffff0;
  if (uVar8 != 0) {
    pvVar2 = (qu->data).base;
    sVar6 = (qu->data).off;
    local_58.base = (void *)((long)pvVar2 + sVar6);
    uVar9 = (qu->data).max - sVar6;
    local_58.cont = (iovec *)0x0;
    bVar3 = uVar9 <= uVar8 && uVar8 - uVar9 != 0;
    local_58.used = uVar8;
    if (bVar3) {
      local_58.cont = &src;
      local_58.used = uVar9;
      src.iov_base = pvVar2;
      src.iov_len = uVar8 - uVar9;
    }
    local_58.clen = (size_t)bVar3;
    uVar9 = (qu->_state).data.pos;
    p_Var10 = qu->_dec;
    if (p_Var10 == (mpt_data_decoder_t)0x0) {
      uVar5 = (uint)(qu->_state).data.msg;
      uVar11 = 0;
      if (-1 < (int)uVar5) {
        uVar11 = (ulong)(uVar5 & 0x7fffffff);
      }
      uVar11 = uVar11 + uVar9;
      if (dst == (void *)0x0) {
        iVar4 = (int)uVar8 - (int)uVar11;
        if (-1 < iVar4) {
          uVar7 = (long)iVar4;
        }
      }
      else {
        if ((uVar11 != 0) &&
           (sVar6 = mpt_message_read(&local_58,uVar11,(void *)0x0), sVar6 < uVar11)) {
          return -0x10;
        }
        uVar7 = mpt_message_read(&local_58,max,dst);
      }
    }
    else {
      uVar8 = (qu->_state).curr;
      uVar7 = uVar9;
      if (uVar8 < uVar9) {
        uVar7 = uVar8;
      }
      if (uVar7 != 0) {
        sVar6 = mpt_message_read(&local_58,uVar7,(void *)0x0);
        if (sVar6 < uVar7) {
          return -0x10;
        }
        uVar8 = (qu->_state).curr;
        uVar9 = (qu->_state).data.pos;
        p_Var10 = qu->_dec;
      }
      (qu->_state).data.pos = uVar9 - uVar7;
      (qu->_state).curr = uVar8 - uVar7;
      src.iov_base = local_58.base;
      src.iov_len = local_58.used;
      iVar4 = (*p_Var10)(&qu->_state,&src,0);
      sVar6 = (qu->_state).data.pos;
      local_58.base = (void *)((long)local_58.base + sVar6);
      (qu->_state).data.pos = sVar6 + uVar7;
      psVar1 = &(qu->_state).curr;
      *psVar1 = *psVar1 + uVar7;
      uVar7 = (qu->_state).data.len;
      if ((dst != (void *)0x0) && (-1 < iVar4)) {
        if (max <= uVar7) {
          uVar7 = max;
        }
        memcpy(dst,local_58.base,uVar7);
      }
    }
  }
  return uVar7;
}

Assistant:

extern ssize_t mpt_queue_peek(MPT_STRUCT(decode_queue) *qu, size_t max, void *dst)
{
	MPT_STRUCT(message) msg;
	struct iovec src;
	size_t off, len;
	int ret;
	
	if (!(len = qu->data.len)) {
		return MPT_ERROR(MissingData);
	}
	off = qu->data.off;
	msg.base = ((uint8_t *) qu->data.base) + off;
	
	/* message setup */
	if (len > (qu->data.max - off)) {
		msg.used = qu->data.max - off;
		msg.clen = 1;
		msg.cont = &src;
		src.iov_base = qu->data.base;
		src.iov_len  = len - msg.used;
	} else {
		msg.used = len;
		msg.clen = 0;
		msg.cont = 0;
	}
	off = qu->_state.data.pos;
	
	/* final data available */
	if (!qu->_dec) {
		if ((ret = qu->_state.data.msg) >= 0) {
			off += ret;
		}
		if (!dst) {
			ret = len - off;
			return ret >= 0 ? ret : MPT_ERROR(MissingData);
		}
		if (off && (mpt_message_read(&msg, off, 0) < off)) {
			return MPT_ERROR(MissingData);
		}
		return mpt_message_read(&msg, max, dst);
	}
	/* work area reduces offset */
	len = qu->_state.curr;
	if (len < off) {
		off = len;
	}
	if (off && (mpt_message_read(&msg, off, 0) < off)) {
		return MPT_ERROR(MissingData);
	}
	src.iov_base = (void *) msg.base;
	src.iov_len  = msg.used;
	
	/* reduce wrap size */
	qu->_state.data.pos -= off;
	qu->_state.curr -= off;
	/* peek for new data */
	ret = qu->_dec(&qu->_state, &src, 0);
	len = qu->_state.data.pos;
	msg.base = (uint8_t *) msg.base + len;
	/* restore offsets */
	qu->_state.data.pos = len + off;
	qu->_state.curr += off;
	len = qu->_state.data.len;
	
	if (ret < 0 || !dst) {
		return len;
	}
	/* get data start and length */
	if (len > max) {
		len = max;
	}
	(void) memcpy(dst, msg.base, len);
	
	return len;
}